

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeObjectHeader::SetAttributes(LargeObjectHeader *this,uint cookie,uchar attributes)

{
  uint uVar1;
  
  uVar1 = *(uint *)&this->next ^ cookie;
  this->attributesAndChecksum =
       (((ushort)(byte)(uVar1 >> 0x18) ^ (ushort)uVar1 ^
         (ushort)(uVar1 >> 0x10) ^ (ushort)(uVar1 >> 8) ^ (ushort)attributes) & 0xff |
       (ushort)attributes << 8) ^ (ushort)cookie;
  return;
}

Assistant:

void
LargeObjectHeader::SetAttributes(uint cookie, unsigned char attributes)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);

    // Calculate the checksum value with new attribute
    unsigned char newCheckSumValue = this->CalculateCheckSum(decodedNext, attributes);
    // pack the (attribute + checksum)
    ushort newAttributeWithCheckSum = ((ushort)attributes << 8) | newCheckSumValue;
    // encode the packed (attribute + checksum) and set it
    this->attributesAndChecksum = this->EncodeAttributesAndChecksum(cookie, newAttributeWithCheckSum);
#else
    this->attributes = attributes;
#endif
}